

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SudokuGitter.cpp
# Opt level: O0

vector<std::vector<cell_*,_std::allocator<cell_*>_>,_std::allocator<std::vector<cell_*,_std::allocator<cell_*>_>_>_>
* __thiscall
SudokuGitter::getQuad
          (vector<std::vector<cell_*,_std::allocator<cell_*>_>,_std::allocator<std::vector<cell_*,_std::allocator<cell_*>_>_>_>
           *__return_storage_ptr__,SudokuGitter *this,uint hoehenIndex,uint breitenInxted)

{
  reference this_00;
  reference this_01;
  reference local_60;
  uint local_58;
  int widthIndex;
  vector<cell_*,_std::allocator<cell_*>_> local_48;
  uint local_30;
  int local_2c;
  int heightIndex;
  uint startWidthIndex;
  uint startHeightIndex;
  uint local_1c;
  uint breitenInxted_local;
  uint hoehenIndex_local;
  SudokuGitter *this_local;
  vector<std::vector<cell_*,_std::allocator<cell_*>_>,_std::allocator<std::vector<cell_*,_std::allocator<cell_*>_>_>_>
  *result;
  
  startWidthIndex._3_1_ = 0;
  startHeightIndex = breitenInxted;
  local_1c = hoehenIndex;
  _breitenInxted_local = this;
  this_local = (SudokuGitter *)__return_storage_ptr__;
  memset(__return_storage_ptr__,0,0x18);
  std::
  vector<std::vector<cell_*,_std::allocator<cell_*>_>,_std::allocator<std::vector<cell_*,_std::allocator<cell_*>_>_>_>
  ::vector(__return_storage_ptr__);
  heightIndex = this->quadHeight * local_1c;
  local_2c = this->quadWidth * startHeightIndex;
  for (local_30 = 0; local_30 < this->quadHeight; local_30 = local_30 + 1) {
    local_48.super__Vector_base<cell_*,_std::allocator<cell_*>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_48.super__Vector_base<cell_*,_std::allocator<cell_*>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_48.super__Vector_base<cell_*,_std::allocator<cell_*>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::vector<cell_*,_std::allocator<cell_*>_>::vector(&local_48);
    std::
    vector<std::vector<cell_*,_std::allocator<cell_*>_>,_std::allocator<std::vector<cell_*,_std::allocator<cell_*>_>_>_>
    ::push_back(__return_storage_ptr__,&local_48);
    std::vector<cell_*,_std::allocator<cell_*>_>::~vector(&local_48);
    for (local_58 = 0; local_58 < this->quadWidth; local_58 = local_58 + 1) {
      this_00 = std::
                vector<std::vector<cell_*,_std::allocator<cell_*>_>,_std::allocator<std::vector<cell_*,_std::allocator<cell_*>_>_>_>
                ::operator[](__return_storage_ptr__,(long)(int)local_30);
      this_01 = std::
                vector<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
                ::operator[](&this->cells,(ulong)(local_30 + heightIndex));
      local_60 = std::vector<cell,_std::allocator<cell>_>::operator[]
                           (this_01,(ulong)(local_58 + local_2c));
      std::vector<cell_*,_std::allocator<cell_*>_>::push_back(this_00,&local_60);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

vector<vector<cell *>> SudokuGitter::getQuad(unsigned int hoehenIndex, unsigned int breitenInxted) {
    vector<vector<cell *>> result = vector<vector<cell *>>();

    unsigned int startHeightIndex = quadHeight * hoehenIndex;
    unsigned int startWidthIndex = quadWidth * breitenInxted;

    for (int heightIndex = 0; heightIndex < quadHeight; heightIndex++) {
        result.push_back(vector<cell *>());
        for (int widthIndex = 0; widthIndex < quadWidth; widthIndex++) {
            result[heightIndex].push_back(&cells[heightIndex + startHeightIndex][widthIndex + startWidthIndex]);
        }
    }

    return result;
}